

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

Field<unsigned_short> * __thiscall
ki::dml::Field<unsigned_short>::get_value_string_abi_cxx11_(Field<unsigned_short> *this)

{
  long in_RSI;
  ostringstream local_190 [8];
  ostringstream oss;
  Field<unsigned_short> *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,*(ushort *)(in_RSI + 0x38));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string Field<ValueT>::get_value_string() const
	{
		std::ostringstream oss;
		oss << m_value;
		return oss.str();
	}